

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O3

void __thiscall
dg::dda::MemorySSATransformation::findDefinitionsInSubgraph
          (MemorySSATransformation *this,RWNode *phi,RWNodeCall *C,DefSite *ds,RWSubgraph *subg)

{
  ulong uVar1;
  undefined8 *puVar2;
  RWBBlock *block;
  _List_node_base *p_Var3;
  undefined8 uVar4;
  ulong uVar5;
  _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  DefUses *this_01;
  mapped_type *pmVar6;
  mapped_type *si;
  const_iterator cVar7;
  RWNode *pRVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  DiscreteInterval<dg::Offset> *subginterval;
  pointer pDVar11;
  DefinitionsMap<dg::dda::RWNode> *this_02;
  undefined8 *puVar12;
  undefined1 auVar13 [8];
  DefSite subgds;
  undefined1 local_f8 [8];
  _Rb_tree_node_base local_f0;
  RWNode *local_c8;
  DefinitionsMap<dg::dda::RWNode> *local_c0;
  DefSite *local_b8;
  DefSite local_b0;
  RWNodeCall *local_98;
  RWSubgraph *local_90;
  ulong local_88;
  ulong local_80;
  _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_78;
  pointer local_70;
  DefUses *local_68;
  DefSite local_60;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  local_48;
  
  local_f8 = (undefined1  [8])subg;
  local_c8 = phi;
  local_98 = C;
  pmVar6 = std::__detail::
           _Map_base<const_dg::dda::RWSubgraph_*,_std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_std::allocator<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWSubgraph_*>,_std::hash<const_dg::dda::RWSubgraph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_dg::dda::RWSubgraph_*,_std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_std::allocator<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWSubgraph_*>,_std::hash<const_dg::dda::RWSubgraph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->_subgraphs_info,(key_type *)local_f8);
  local_f8 = (undefined1  [8])subg;
  si = std::__detail::
       _Map_base<const_dg::dda::RWSubgraph_*,_std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_std::allocator<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWSubgraph_*>,_std::hash<const_dg::dda::RWSubgraph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
       ::operator[]((_Map_base<const_dg::dda::RWSubgraph_*,_std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_std::allocator<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWSubgraph_*>,_std::hash<const_dg::dda::RWSubgraph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->_subgraphs_info,(key_type *)local_f8);
  local_90 = subg;
  computeModRef(this,subg,si);
  this_02 = &(pmVar6->summary).outputs;
  DefinitionsMap<dg::dda::RWNode>::get
            ((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              *)local_f8,this_02,ds);
  local_68 = &local_c8->defuse;
  RWNode::DefUses::
  add<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
            (local_68,(set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                       *)local_f8);
  std::
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  ::_M_erase((_Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              *)local_f8,(_Link_type)local_f0._M_parent);
  local_c0 = this_02;
  local_b8 = ds;
  DefinitionsMap<dg::dda::RWNode>::undefinedIntervals(&local_48,this_02,ds);
  local_70 = local_48.
             super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_88 = Offset::UNKNOWN - 1;
    local_78 = (_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)&(si->modref).maydef;
    local_80 = Offset::UNKNOWN;
    pDVar11 = local_48.
              super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_00 = local_78;
      uVar5 = local_80;
      local_b0.offset.offset = (pDVar11->start).offset;
      uVar1 = (pDVar11->end).offset;
      uVar10 = local_80;
      if (uVar1 != local_80) {
        uVar10 = uVar1 - local_b0.offset.offset;
        if (uVar1 < local_b0.offset.offset) {
          uVar10 = local_80;
        }
        if (local_b0.offset.offset == local_80) {
          uVar10 = local_80;
        }
      }
      local_b0.len.offset = uVar10 + 1;
      if (local_88 <= uVar10) {
        local_b0.len.offset = local_80;
      }
      local_f8 = (undefined1  [8])local_b8->target;
      if (uVar10 == local_80) {
        local_b0.len.offset = local_80;
      }
      local_b0.target = (RWNode *)local_f8;
      cVar7 = std::
              _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(local_78,(key_type *)local_f8);
      this_01 = local_68;
      if (cVar7.
          super__Node_iterator_base<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        local_f8 = (undefined1  [8])UNKNOWN_MEMORY;
        cVar7 = std::
                _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(this_00,(key_type *)local_f8);
        if (cVar7.
            super__Node_iterator_base<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false>
            ._M_cur != (__node_type *)0x0) {
          pRVar8 = createPhi(this,&local_b0,OUTARG);
          DefinitionsMap<dg::dda::RWNode>::add(local_c0,&local_b0,pRVar8);
          local_60.target = (RWNode *)UNKNOWN_MEMORY;
          local_60.offset.offset = uVar5;
          local_60.len.offset = uVar5;
          DefinitionsMap<dg::dda::RWNode>::get
                    ((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                      *)local_f8,(DefinitionsMap<dg::dda::RWNode> *)this_00,&local_60);
          if (local_f0._M_left != &local_f0) {
            p_Var9 = local_f0._M_left;
            do {
              RWNode::DefUses::add(&pRVar8->defuse,*(RWNode **)(p_Var9 + 1));
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
            } while (p_Var9 != &local_f0);
          }
          std::
          _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
          ::_M_erase((_Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                      *)local_f8,(_Link_type)local_f0._M_parent);
          RWNode::DefUses::add(this_01,pRVar8);
        }
        findDefinitions((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)local_f8,
                        this,&local_98->super_RWNode,&local_b0);
        uVar4 = local_f0._0_8_;
        (local_c8->defuse)._init = true;
        for (auVar13 = local_f8; auVar13 != (undefined1  [8])uVar4;
            auVar13 = (undefined1  [8])&((RWNode *)auVar13)->super_SubgraphNode<dg::dda::RWNode>) {
          RWNode::DefUses::add(this_01,(RWNode *)((RWNode *)auVar13)->_vptr_RWNode);
        }
        if (local_f8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_f8,(long)local_f0._M_parent - (long)local_f8);
        }
      }
      else {
        pRVar8 = createPhi(this,&local_b0,OUTARG);
        DefinitionsMap<dg::dda::RWNode>::add(local_c0,&local_b0,pRVar8);
        RWNode::DefUses::add(this_01,pRVar8);
        puVar12 = *(undefined8 **)local_90;
        puVar2 = *(undefined8 **)(local_90 + 8);
        if (puVar12 != puVar2) {
          do {
            block = (RWBBlock *)*puVar12;
            if (((((block->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                   super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                   _successors.
                   super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                   _M_impl.super__Vector_impl_data._M_start ==
                   *(pointer *)
                    ((long)&(block->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                            super_CFGElement<dg::dda::RWBBlock>.
                            super_ElemWithEdges<dg::dda::RWBBlock>._successors.
                            super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>
                            ._M_impl.super__Vector_impl_data + 8)) &&
                 ((block->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
                  super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                  _M_node.super__List_node_base._M_next !=
                  (_List_node_base *)
                  &(block->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes)) &&
                (p_Var3 = (block->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
                          super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                          _M_impl._M_node.super__List_node_base._M_prev[1]._M_next,
                p_Var3 != (_List_node_base *)0x0)) && (*(int *)&p_Var3[9]._M_next == 0xc)) {
              findDefinitions((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                              local_f8,this,block,local_b8);
              uVar4 = local_f0._0_8_;
              (pRVar8->defuse)._init = true;
              for (auVar13 = local_f8; auVar13 != (undefined1  [8])uVar4;
                  auVar13 = (undefined1  [8])
                            &((RWNode *)auVar13)->super_SubgraphNode<dg::dda::RWNode>) {
                RWNode::DefUses::add(&pRVar8->defuse,(RWNode *)((RWNode *)auVar13)->_vptr_RWNode);
              }
              if (local_f8 != (undefined1  [8])0x0) {
                operator_delete((void *)local_f8,(long)local_f0._M_parent - (long)local_f8);
              }
            }
            puVar12 = puVar12 + 1;
          } while (puVar12 != puVar2);
        }
      }
      pDVar11 = pDVar11 + 1;
    } while (pDVar11 != local_70);
  }
  if (local_48.
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MemorySSATransformation::findDefinitionsInSubgraph(RWNode *phi,
                                                        RWNodeCall *C,
                                                        const DefSite &ds,
                                                        RWSubgraph *subg) {
    DBG_SECTION_BEGIN(tmp,
                      "Searching definitions in subgraph " << subg->getName());
    auto &summary = getSubgraphSummary(subg);
    auto &si = getSubgraphInfo(subg);
    computeModRef(subg, si);
    assert(si.modref.isInitialized());

    // Add the definitions that we have found in previous exploration
    phi->addDefUse(summary.getOutputs(ds));

    // search the definitions that we have not found yet
    for (auto &subginterval : summary.getUncoveredOutputs(ds)) {
        // we must create a new phi for each subgraph inside the subgraph
        // (these phis will be merged by the single 'phi').
        // Of course, we create them only when not already present.
        auto subgds =
                DefSite{ds.target, subginterval.start, subginterval.length()};

        // do not search the procedure if it cannot define the memory
        // (this saves creating PHI nodes). If it may define only
        // unknown memory, add that definitions directly and continue searching
        // before the call.
        if (!si.modref.mayDefine(ds.target)) {
            if (si.modref.mayDefineUnknown()) {
                auto *subgphi =
                        createPhi(subgds, /* type = */ RWNodeType::OUTARG);
                summary.addOutput(subgds, subgphi);
                for (const auto &it : si.modref.getMayDef(UNKNOWN_MEMORY)) {
                    subgphi->addDefUse(it);
                }
                phi->addDefUse(subgphi);
            }
            // continue the search before the call
            phi->addDefUse(findDefinitions(C, subgds));
            continue;
        }

        auto *subgphi = createPhi(subgds, /* type = */ RWNodeType::OUTARG);
        summary.addOutput(subgds, subgphi);
        phi->addDefUse(subgphi);

        // find the new phi operands
        for (auto *subgblock : subg->bblocks()) {
            if (subgblock->hasSuccessors()) {
                continue;
            }
            if (!subgblock->isReturnBBlock()) {
                // ignore blocks that does not return to this subgraph
                continue;
            }
            subgphi->addDefUse(findDefinitions(subgblock, ds));
        }
    }
    DBG_SECTION_END(tmp, "Done searching definitions in subgraph "
                                 << subg->getName());
}